

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O2

void __thiscall r_exec::_Mem::stop(_Mem *this)

{
  _ReductionJob *j;
  TimeJob *j_00;
  ulong uVar1;
  DebugStream local_6a;
  allocator local_69;
  unique_lock<std::mutex> lock;
  string local_48 [32];
  
  std::mutex::lock(&this->m_stateMutex);
  if (this->state == RUNNING) {
    for (uVar1 = 0; uVar1 < this->reduction_core_count; uVar1 = uVar1 + 1) {
      j = (_ReductionJob *)operator_new(0x18);
      (j->super__Object)._vptr__Object = (_func_int **)0x0;
      (j->super__Object).refCount.super___atomic_base<long>._M_i = 0;
      j->ijt = 0;
      ShutdownReductionCore::ShutdownReductionCore((ShutdownReductionCore *)j);
      pushReductionJob(this,j);
    }
    for (uVar1 = 0; uVar1 < this->time_core_count; uVar1 = uVar1 + 1) {
      j_00 = (TimeJob *)operator_new(0x20);
      ShutdownTimeCore::ShutdownTimeCore((ShutdownTimeCore *)j_00);
      pushTimeJob(this,j_00);
    }
    this->state = STOPPED;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_stateMutex);
    for (uVar1 = 0;
        uVar1 < (ulong)((long)(this->m_coreThreads).
                              super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(this->m_coreThreads).
                              super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
      std::thread::join();
    }
    std::unique_lock<std::mutex>::unique_lock(&lock,&this->m_coreCountMutex);
    while ((this->m_coreCount).super___atomic_base<unsigned_long>._M_i != 0) {
      std::condition_variable::wait((unique_lock *)&this->m_coresRunning);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::clear(&this->m_coreThreads);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
  }
  else {
    std::__cxx11::string::string(local_48,"mem",&local_69);
    std::__cxx11::string::string((string *)&lock,local_48);
    DebugStream::DebugStream(&local_6a,(string *)&lock);
    std::__cxx11::string::~string((string *)&lock);
    DebugStream::operator<<(&local_6a,"memory asked to stop while not running");
    DebugStream::~DebugStream(&local_6a);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void _Mem::stop()
{
    m_stateMutex.lock();

    if (state != RUNNING) {
        ::debug("mem") << "memory asked to stop while not running";
        return;
    }

    // We need to do this because things are wait()ing
    uint64_t i;

    for (i = 0; i < reduction_core_count; ++i) {
        pushReductionJob(new ShutdownReductionCore());
    }

    for (i = 0; i < time_core_count; ++i) {
        pushTimeJob(new ShutdownTimeCore());
    }

    state = STOPPED;
    m_stateMutex.unlock();

    for (i = 0; i < m_coreThreads.size(); ++i) {
        m_coreThreads[i].join();
    }

    std::unique_lock<std::mutex> lock(m_coreCountMutex);

    while (m_coreCount > 0) {
        m_coresRunning.wait(lock);
    }

    m_coreThreads.clear();
}